

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void eigensystem(double *mat,int N,double *eval,double *evec)

{
  ulong uVar1;
  undefined8 *__dest;
  long lVar2;
  ulong uVar3;
  double *pdVar4;
  ulong uVar5;
  double *pdVar6;
  long lVar7;
  int iVar8;
  double *pdVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  double *pdVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  size_t __nmemb;
  uint uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  ulong local_68;
  ulong local_58;
  ulong local_38;
  
  uVar16 = (ulong)(uint)N;
  __nmemb = (size_t)N;
  __dest = (undefined8 *)calloc(__nmemb,8);
  memcpy(evec,mat,__nmemb * __nmemb * 8);
  if (1 < N) {
    uVar3 = uVar16 - 1;
    if (N != 2) {
      uVar12 = (ulong)(N - 1);
      pdVar4 = evec + uVar3 * uVar16;
      uVar15 = uVar16;
      do {
        uVar5 = uVar3;
        lVar2 = uVar5 * uVar16;
        uVar3 = 0;
        dVar21 = 0.0;
        do {
          dVar21 = dVar21 + ABS(pdVar4[uVar3]);
          uVar3 = uVar3 + 1;
        } while (uVar12 != uVar3);
        if ((dVar21 != 0.0) || (NAN(dVar21))) {
          dVar24 = 0.0;
          uVar3 = 0;
          do {
            dVar18 = pdVar4[uVar3] / dVar21;
            pdVar4[uVar3] = dVar18;
            dVar24 = dVar24 + dVar18 * dVar18;
            uVar3 = uVar3 + 1;
          } while (uVar12 != uVar3);
          dVar18 = evec[lVar2 + (uVar15 - 2)];
          if (dVar24 < 0.0) {
            dVar20 = sqrt(dVar24);
          }
          else {
            dVar20 = SQRT(dVar24);
          }
          dVar19 = 0.0;
          dVar20 = (double)(~-(ulong)(dVar18 < 0.0) & (ulong)-dVar20 |
                           -(ulong)(dVar18 < 0.0) & (ulong)dVar20);
          __dest[uVar5] = dVar21 * dVar20;
          dVar24 = dVar24 - dVar18 * dVar20;
          evec[lVar2 + (uVar15 - 2)] = dVar18 - dVar20;
          iVar8 = 1;
          uVar3 = 0;
          pdVar6 = evec;
          pdVar9 = evec;
          do {
            uVar11 = (long)iVar8 - 1;
            pdVar13 = (double *)(uVar16 * 8 * (long)iVar8 + (long)pdVar6);
            evec[uVar5 + uVar3 * uVar16] = evec[lVar2 + uVar3] / dVar24;
            uVar14 = 0xffffffffffffffff;
            dVar21 = 0.0;
            do {
              dVar21 = dVar21 + pdVar9[uVar14 + 1] * pdVar4[uVar14 + 1];
              uVar14 = uVar14 + 1;
              uVar1 = uVar3;
            } while (uVar3 != uVar14);
            while ((long)uVar1 < (long)(uVar15 - 2)) {
              dVar21 = dVar21 + *pdVar13 * pdVar4[uVar11 + 1];
              pdVar13 = pdVar13 + uVar16;
              uVar11 = uVar11 + 1;
              uVar1 = uVar11;
            }
            __dest[uVar3] = dVar21 / dVar24;
            lVar7 = lVar2 + uVar3;
            uVar3 = uVar3 + 1;
            dVar19 = dVar19 + (dVar21 / dVar24) * evec[lVar7];
            iVar8 = iVar8 + 1;
            pdVar9 = pdVar9 + uVar16;
            pdVar6 = pdVar6 + 1;
          } while (uVar3 != uVar12);
          lVar7 = 1;
          uVar3 = 0;
          pdVar6 = evec;
          do {
            dVar21 = evec[lVar2 + uVar3];
            dVar18 = (-dVar19 / (dVar24 + dVar24)) * dVar21 + (double)__dest[uVar3];
            __dest[uVar3] = dVar18;
            lVar10 = 0;
            do {
              pdVar6[lVar10] =
                   pdVar6[lVar10] - ((double)__dest[lVar10] * dVar21 + pdVar4[lVar10] * dVar18);
              lVar10 = lVar10 + 1;
            } while (lVar7 != lVar10);
            uVar3 = uVar3 + 1;
            lVar7 = lVar7 + 1;
            pdVar6 = pdVar6 + uVar16;
          } while (uVar3 != uVar12);
        }
        else {
          __dest[uVar5] = evec[lVar2 + (uVar15 - 2)];
          dVar24 = 0.0;
        }
        eval[uVar5] = dVar24;
        uVar12 = uVar12 - 1;
        pdVar4 = pdVar4 + -uVar16;
        uVar3 = uVar5 - 1;
        uVar15 = uVar5;
      } while (uVar5 != 2);
      uVar3 = 1;
    }
    __dest[uVar3] = evec[uVar3 * uVar16];
    eval[uVar3] = 0.0;
  }
  *eval = 0.0;
  *__dest = 0;
  if (N < 1) {
LAB_0011f069:
    free(__dest);
    return;
  }
  uVar3 = 0;
  pdVar4 = evec;
  pdVar6 = evec;
  do {
    if ((uVar3 == 0) || ((eval[uVar3] == 0.0 && (!NAN(eval[uVar3]))))) {
      uVar15 = (ulong)(uint)((int)uVar3 * N);
      eval[uVar3] = evec[uVar3 + uVar15];
      evec[uVar3 + uVar15] = 1.0;
      if (uVar3 != 0) goto LAB_0011ec40;
    }
    else {
      uVar15 = 0;
      pdVar9 = evec;
      do {
        dVar21 = 0.0;
        uVar12 = 0;
        pdVar13 = pdVar9;
        do {
          dVar21 = dVar21 + pdVar6[uVar12] * *pdVar13;
          uVar12 = uVar12 + 1;
          pdVar13 = pdVar13 + uVar16;
        } while (uVar3 != uVar12);
        lVar2 = 0;
        uVar12 = uVar3;
        do {
          *(double *)((long)pdVar9 + lVar2) =
               *(double *)((long)pdVar4 + lVar2) * -dVar21 + *(double *)((long)pdVar9 + lVar2);
          lVar2 = lVar2 + uVar16 * 8;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
        uVar15 = uVar15 + 1;
        pdVar9 = pdVar9 + 1;
      } while (uVar15 != uVar3);
      uVar15 = (ulong)(uint)((int)uVar3 * N);
      eval[uVar3] = evec[uVar3 + uVar15];
      evec[uVar3 + uVar15] = 1.0;
LAB_0011ec40:
      uVar15 = 0;
      pdVar9 = pdVar4;
      do {
        pdVar6[uVar15] = 0.0;
        *pdVar9 = 0.0;
        uVar15 = uVar15 + 1;
        pdVar9 = pdVar9 + uVar16;
      } while (uVar3 != uVar15);
    }
    uVar3 = uVar3 + 1;
    pdVar6 = pdVar6 + uVar16;
    pdVar4 = pdVar4 + 1;
  } while (uVar3 != uVar16);
  if (N < 2) {
    __dest[__nmemb - 1] = 0;
    local_58 = 0;
    if (N != 1) goto LAB_0011f069;
  }
  else {
    uVar17 = N - 1;
    memmove(__dest,__dest + 1,(ulong)uVar17 * 8);
    __dest[uVar17] = 0;
    local_58 = (ulong)uVar17;
  }
  local_68 = 0xffffffffffffffff;
  local_38 = 0;
LAB_0011ed1e:
  iVar8 = 0;
  uVar3 = local_68;
LAB_0011ed24:
  uVar15 = local_58;
  uVar12 = local_58;
  if (uVar3 - local_58 != -1) goto code_r0x0011ed2e;
  goto LAB_0011ed77;
code_r0x0011ed2e:
  dVar21 = ABS(eval[uVar3 + 2]) + ABS(eval[uVar3 + 1]);
  lVar2 = uVar3 + 1;
  uVar3 = uVar3 + 1;
  if ((ABS((double)__dest[lVar2]) + dVar21 != dVar21) ||
     (NAN(ABS((double)__dest[lVar2]) + dVar21) || NAN(dVar21))) goto LAB_0011ed24;
  uVar15 = uVar3 & 0xffffffff;
  uVar12 = uVar3;
LAB_0011ed77:
  if (uVar15 != local_38) {
    if (iVar8 == 0x1e) {
      printf("Too many iterations in tqli");
    }
    dVar24 = eval[local_38];
    dVar21 = (double)__dest[local_38];
    dVar20 = (eval[local_38 + 1] - dVar24) / (dVar21 + dVar21);
    dVar18 = ABS(dVar20);
    if (dVar18 <= 1.0) {
      dVar18 = SQRT(dVar20 * dVar20 + 1.0);
    }
    else {
      dVar18 = SQRT((1.0 / dVar18) * (1.0 / dVar18) + 1.0) * dVar18;
    }
    dVar19 = 0.0;
    dVar21 = dVar21 / ((double)(~-(ulong)(dVar20 < 0.0) & (ulong)ABS(dVar18) |
                               ((ulong)dVar18 | 0x8000000000000000) & -(ulong)(dVar20 < 0.0)) +
                      dVar20) + (eval[uVar15] - dVar24);
    if (local_38 < uVar15) {
      lVar2 = (long)(int)uVar12;
      pdVar4 = evec + lVar2 + -1;
      lVar7 = lVar2 << 0x20;
      dVar18 = 1.0;
      dVar24 = 1.0;
      do {
        dVar24 = dVar24 * (double)__dest[lVar2 + -1];
        dVar22 = ABS(dVar24);
        dVar20 = ABS(dVar21);
        if (dVar22 <= dVar20) {
          if ((dVar21 != 0.0) || (NAN(dVar21))) {
            dVar23 = (dVar22 / dVar20) * (dVar22 / dVar20);
            goto LAB_0011ef0a;
          }
          lVar2 = (long)(int)lVar2;
          __dest[lVar2] = 0;
LAB_0011f027:
          eval[lVar2] = eval[lVar2] - dVar19;
          goto LAB_0011f03e;
        }
        dVar23 = (dVar20 / dVar22) * (dVar20 / dVar22);
        dVar20 = dVar22;
LAB_0011ef0a:
        dVar20 = SQRT(dVar23 + 1.0) * dVar20;
        __dest[lVar2] = dVar20;
        if ((dVar20 == 0.0) && (!NAN(dVar20))) goto LAB_0011f027;
        lVar10 = lVar2 + -1;
        dVar22 = dVar18 * (double)__dest[lVar2 + -1];
        dVar24 = dVar24 / dVar20;
        dVar18 = dVar21 / dVar20;
        dVar20 = eval[lVar2] - dVar19;
        dVar21 = (eval[lVar10] - dVar20) * dVar24 + (dVar18 + dVar18) * dVar22;
        dVar19 = dVar24 * dVar21;
        eval[lVar2] = dVar20 + dVar19;
        lVar2 = lVar7;
        uVar3 = uVar16;
        pdVar6 = pdVar4;
        do {
          dVar20 = *(double *)((long)evec + (lVar2 >> 0x1d));
          dVar23 = *pdVar6;
          *(double *)((long)evec + (lVar2 >> 0x1d)) = dVar24 * dVar23 + dVar18 * dVar20;
          *pdVar6 = dVar23 * dVar18 + dVar20 * -dVar24;
          pdVar6 = pdVar6 + uVar16;
          lVar2 = lVar2 + (uVar16 << 0x20);
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
        dVar21 = dVar21 * dVar18 + -dVar22;
        pdVar4 = pdVar4 + -1;
        lVar7 = lVar7 + -0x100000000;
        lVar2 = lVar10;
      } while ((long)local_38 < lVar10);
      dVar24 = eval[local_38];
    }
    eval[local_38] = dVar24 - dVar19;
    __dest[local_38] = dVar21;
LAB_0011f03e:
    iVar8 = iVar8 + 1;
    __dest[uVar15] = 0;
    uVar3 = local_68;
    goto LAB_0011ed24;
  }
  local_38 = local_38 + 1;
  local_68 = local_68 + 1;
  if (local_38 != uVar16) goto LAB_0011ed1e;
  goto LAB_0011f069;
}

Assistant:

void eigensystem(double *mat, int N, double *eval, double *evec) {
	double *e;

	e = (double*)calloc(N, sizeof(double));

	memcpy(evec, mat, sizeof(double)*N*N);

	tred2(evec, N, eval, e);
	tqli(eval, N, e, evec);

	free(e);
}